

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

void getLpMatrixCoefficient(HighsLp *lp,HighsInt Xrow,HighsInt Xcol,double *val)

{
  int iVar1;
  pointer piVar2;
  ulong uVar3;
  int iVar4;
  double dVar5;
  
  piVar2 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar2[Xcol];
  uVar3 = (ulong)iVar1;
  iVar4 = piVar2[(long)Xcol + 1];
  dVar5 = 0.0;
  if (iVar1 < iVar4) {
    iVar4 = iVar4 - iVar1;
    do {
      if ((lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3] == Xrow) {
        if (-1 < (long)uVar3) {
          dVar5 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar3 & 0xffffffff];
        }
        break;
      }
      uVar3 = uVar3 + 1;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  *val = dVar5;
  return;
}

Assistant:

void getLpMatrixCoefficient(const HighsLp& lp, const HighsInt Xrow,
                            const HighsInt Xcol, double* val) {
  assert(0 <= Xrow && Xrow < lp.num_row_);
  assert(0 <= Xcol && Xcol < lp.num_col_);

  HighsInt get_el = -1;
  for (HighsInt el = lp.a_matrix_.start_[Xcol];
       el < lp.a_matrix_.start_[Xcol + 1]; el++) {
    if (lp.a_matrix_.index_[el] == Xrow) {
      get_el = el;
      break;
    }
  }
  if (get_el < 0) {
    *val = 0;
  } else {
    *val = lp.a_matrix_.value_[get_el];
  }
}